

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_extension_instances
               (lyout *out,int level,lys_module *module,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
               lys_ext_instance **ext,uint count)

{
  int iVar1;
  LY_STMT LVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  ushort *puVar5;
  byte *pbVar6;
  long *plVar7;
  uint8_t substmt_index_00;
  char *pcVar8;
  bool bVar9;
  lys_node *local_90;
  lys_node *siter;
  void *p;
  void **pp;
  char *str;
  uint16_t *flags;
  int local_60;
  int c;
  int j;
  int i;
  int content2;
  int content;
  lyext_substmt *info;
  char *prefix;
  lys_module *mod;
  uint x;
  uint u;
  lys_ext_instance **ext_local;
  uint8_t substmt_index_local;
  lys_module *plStack_20;
  LYEXT_SUBSTMT substmt_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  info = (lyext_substmt *)0x0;
  mod._4_4_ = 0;
  _x = ext;
  ext_local._3_1_ = substmt_index;
  ext_local._4_4_ = substmt;
  plStack_20 = module;
  module_local._4_4_ = level;
  plStack_10 = out;
  do {
    if (count <= mod._4_4_) {
      return;
    }
    if (((((_x[mod._4_4_]->flags & 1) == 0) && ((uint)_x[mod._4_4_]->insubstmt == ext_local._4_4_))
        && (_x[mod._4_4_]->insubstmt_index == ext_local._3_1_)) &&
       ((_x[mod._4_4_]->def->module != *(plStack_20->ctx->models).list ||
        (((iVar1 = strcmp(_x[mod._4_4_]->arg_value,"operation"), iVar1 != 0 &&
          (iVar1 = strcmp(_x[mod._4_4_]->arg_value,"select"), iVar1 != 0)) &&
         (iVar1 = strcmp(_x[mod._4_4_]->arg_value,"type"), iVar1 != 0)))))) {
      plVar3 = lys_main_module(_x[mod._4_4_]->def->module);
      prefix = (char *)plVar3;
      plVar4 = lys_main_module(plStack_20);
      if (plVar3 == plVar4) {
        info = (lyext_substmt *)plStack_20->prefix;
      }
      else {
        for (mod._0_4_ = 0; (uint)mod < plStack_20->imp_size; mod._0_4_ = (uint)mod + 1) {
          if ((lys_module *)prefix == plStack_20->imp[(uint)mod].module) {
            info = (lyext_substmt *)plStack_20->imp[(uint)mod].prefix;
            break;
          }
        }
      }
      if (info == (lyext_substmt *)0x0) {
        __assert_fail("prefix",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yin.c"
                      ,0x7ad,
                      "void yin_print_extension_instances(struct lyout *, int, const struct lys_module *, LYEXT_SUBSTMT, uint8_t, struct lys_ext_instance **, unsigned int)"
                     );
      }
      i = 0;
      if (_x[mod._4_4_]->arg_value == (char *)0x0) {
        yin_print_open(plStack_10,module_local._4_4_,(char *)info,_x[mod._4_4_]->def->name,
                       (char *)0x0,(char *)0x0,0);
      }
      else if ((_x[mod._4_4_]->def->flags & 1) == 0) {
        yin_print_open(plStack_10,module_local._4_4_,(char *)info,_x[mod._4_4_]->def->name,
                       _x[mod._4_4_]->def->argument,_x[mod._4_4_]->arg_value,0);
      }
      else {
        i = 1;
        yin_print_open(plStack_10,module_local._4_4_,(char *)info,_x[mod._4_4_]->def->name,
                       (char *)0x0,(char *)0x0,1);
        module_local._4_4_ = module_local._4_4_ + 1;
        ly_print(plStack_10,"%*s<%s:%s>",(ulong)(uint)(module_local._4_4_ * 2),"",info,
                 _x[mod._4_4_]->def->argument);
        lyxml_dump_text(plStack_10,_x[mod._4_4_]->arg_value);
        ly_print(plStack_10,"</%s:%s>\n",info,_x[mod._4_4_]->def->argument);
        module_local._4_4_ = module_local._4_4_ + -1;
      }
      if (_x[mod._4_4_]->ext_size != '\0') {
        yin_print_close_parent(plStack_10,&i);
        yin_print_extension_instances
                  (plStack_10,module_local._4_4_ + 1,plStack_20,LYEXT_SUBSTMT_SELF,'\0',
                   _x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size);
      }
      if (((_x[mod._4_4_]->ext_type != '\0') && (_x[mod._4_4_]->ext_type == '\x01')) &&
         (_content2 = _x[mod._4_4_][1].def, _content2 != (lys_ext *)0x0)) {
        module_local._4_4_ = module_local._4_4_ + 1;
        c = 0;
        while (*(int *)(_content2->padding + (long)c * 0x18 + -0x1b) != 0) {
          switch(*(undefined4 *)(_content2->padding + (long)c * 0x18 + -0x1b)) {
          case 1:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_ARGUMENT,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              yin_print_close_parent(plStack_10,&i);
              if (*(uint *)&_content2->ref < 2) {
                j = 0;
                yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"argument","name",
                               (char *)*plVar7,0);
                local_60 = -1;
                while (local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                               (char)local_60 + '\x01',LYEXT_SUBSTMT_ARGUMENT),
                      local_60 != -1) {
                  yin_print_close_parent(plStack_10,&j);
                  yin_print_extension_instances
                            (plStack_10,module_local._4_4_ + 1,plStack_20,LYEXT_SUBSTMT_ARGUMENT,
                             '\0',_x[mod._4_4_]->ext + local_60,1);
                }
                if (((char)plVar7[1] == '\x01') ||
                   (iVar1 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,'\0',
                                         LYEXT_SUBSTMT_YINELEM), iVar1 != -1)) {
                  yin_print_close_parent(plStack_10,&j);
                  pcVar8 = "false";
                  if ((char)plVar7[1] == '\x01') {
                    pcVar8 = "true";
                  }
                  yin_print_substmt(plStack_10,module_local._4_4_ + 1,LYEXT_SUBSTMT_YINELEM,'\0',
                                    pcVar8,plStack_20,_x[mod._4_4_]->ext,
                                    (uint)_x[mod._4_4_]->ext_size);
                }
                yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"argument",j);
              }
              else {
                flags._4_4_ = 0;
                while (*(long *)(*plVar7 + (long)(int)flags._4_4_ * 8) != 0) {
                  j = 0;
                  yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"argument","name",
                                 *(char **)(*plVar7 + (long)(int)flags._4_4_ * 8),0);
                  local_60 = -1;
                  while( true ) {
                    local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                            (char)local_60 + '\x01',LYEXT_SUBSTMT_ARGUMENT);
                    substmt_index_00 = (uint8_t)flags._4_4_;
                    if (local_60 == -1) break;
                    if (_x[mod._4_4_]->ext[local_60]->insubstmt_index == flags._4_4_) {
                      yin_print_close_parent(plStack_10,&j);
                      yin_print_extension_instances
                                (plStack_10,module_local._4_4_ + 1,plStack_20,LYEXT_SUBSTMT_ARGUMENT
                                 ,substmt_index_00,_x[mod._4_4_]->ext + local_60,1);
                    }
                  }
                  if (*(char *)(plVar7[1] + (long)(int)flags._4_4_) == '\x01') {
                    yin_print_close_parent(plStack_10,&j);
                    pcVar8 = "false";
                    if (*(char *)(plVar7[1] + (long)(int)flags._4_4_) == '\x01') {
                      pcVar8 = "true";
                    }
                    yin_print_substmt(plStack_10,module_local._4_4_ + 1,LYEXT_SUBSTMT_YINELEM,
                                      substmt_index_00,pcVar8,plStack_20,_x[mod._4_4_]->ext,
                                      (uint)_x[mod._4_4_]->ext_size);
                  }
                  else {
                    local_60 = -1;
                    do {
                      local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                              (char)local_60 + '\x01',LYEXT_SUBSTMT_YINELEM);
                      if (local_60 == -1) goto LAB_001b229b;
                    } while (_x[mod._4_4_]->ext[local_60]->insubstmt_index != flags._4_4_);
                    yin_print_close_parent(plStack_10,&j);
                    pcVar8 = "false";
                    if (*(char *)(plVar7[1] + (long)(int)flags._4_4_) == '\x01') {
                      pcVar8 = "true";
                    }
                    yin_print_substmt(plStack_10,module_local._4_4_ + 1,LYEXT_SUBSTMT_YINELEM,
                                      substmt_index_00,pcVar8,plStack_20,
                                      _x[mod._4_4_]->ext + local_60,
                                      (uint)_x[mod._4_4_]->ext_size - local_60);
                  }
LAB_001b229b:
                  yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"argument",j);
                  flags._4_4_ = flags._4_4_ + 1;
                }
              }
            }
            break;
          case 2:
          case 4:
          case 5:
          case 6:
          case 7:
          case 8:
          case 9:
          case 10:
          case 0xb:
          case 0xc:
          case 0xd:
          case 0xe:
          case 0xf:
          case 0x10:
          case 0x11:
            yin_print_extcomplex_str
                      (plStack_10,module_local._4_4_,plStack_20,
                       (lys_ext_instance_complex *)_x[mod._4_4_],
                       *(LY_STMT *)(_content2->padding + (long)c * 0x18 + -0x1b),&i);
            break;
          case 3:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_BELONGSTO,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)&_content2->ref < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"belongs-to","module",
                               (char *)*plVar7,1);
                local_60 = -1;
                while (local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                               (char)local_60 + '\x01',LYEXT_SUBSTMT_BELONGSTO),
                      local_60 != -1) {
                  yin_print_extension_instances
                            (plStack_10,module_local._4_4_ + 1,plStack_20,LYEXT_SUBSTMT_BELONGSTO,
                             '\0',_x[mod._4_4_]->ext + local_60,1);
                }
                yin_print_substmt(plStack_10,module_local._4_4_ + 1,LYEXT_SUBSTMT_PREFIX,'\0',
                                  (char *)plVar7[1],plStack_20,_x[mod._4_4_]->ext,
                                  (uint)_x[mod._4_4_]->ext_size);
                yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"belongs-to",1);
              }
              else {
                flags._4_4_ = 0;
                while (*(long *)(*plVar7 + (long)(int)flags._4_4_ * 8) != 0) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"belongs-to","module",
                                 *(char **)(*plVar7 + (long)(int)flags._4_4_ * 8),1);
                  local_60 = -1;
                  while( true ) {
                    local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                            (char)local_60 + '\x01',LYEXT_SUBSTMT_BELONGSTO);
                    if (local_60 == -1) break;
                    yin_print_extension_instances
                              (plStack_10,module_local._4_4_ + 1,plStack_20,LYEXT_SUBSTMT_BELONGSTO,
                               (uint8_t)flags._4_4_,_x[mod._4_4_]->ext + local_60,1);
                  }
                  yin_print_substmt(plStack_10,module_local._4_4_ + 1,LYEXT_SUBSTMT_PREFIX,
                                    (uint8_t)flags._4_4_,
                                    *(char **)(plVar7[1] + (long)(int)flags._4_4_ * 8),plStack_20,
                                    _x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size);
                  yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"belongs-to",1);
                  flags._4_4_ = flags._4_4_ + 1;
                }
              }
            }
            break;
          case 0x12:
            plVar7 = (long *)((long)&_x[mod._4_4_][1].arg_value +
                             *(long *)(_content2->padding + (long)c * 0x18 + -0x13) + 4);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_signed(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_VALUE,'\0',plStack_20,
                                 _x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size,*(int *)*plVar7);
              }
              else {
                flags._4_4_ = 0;
                while (*(long *)(*plVar7 + (long)(int)flags._4_4_ * 8) != 0) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_signed(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_VALUE,
                                   (uint8_t)flags._4_4_,plStack_20,_x[mod._4_4_]->ext,
                                   (uint)_x[mod._4_4_]->ext_size,
                                   **(int **)(*plVar7 + (long)(int)flags._4_4_ * 8));
                  flags._4_4_ = flags._4_4_ + 1;
                }
              }
            }
            break;
          default:
            break;
          case 0x14:
            yin_print_extcomplex_bool
                      (plStack_10,module_local._4_4_,plStack_20,
                       (lys_ext_instance_complex *)_x[mod._4_4_],LY_STMT_MODIFIER,"invert-match",
                       (char *)0x0,&i);
            break;
          case 0x15:
            yin_print_extcomplex_bool
                      (plStack_10,module_local._4_4_,plStack_20,
                       (lys_ext_instance_complex *)_x[mod._4_4_],
                       *(LY_STMT *)(_content2->padding + (long)c * 0x18 + -0x1b),"true","false",&i);
            break;
          case 0x17:
            yin_print_extcomplex_flags
                      (plStack_10,module_local._4_4_,plStack_20,
                       (lys_ext_instance_complex *)_x[mod._4_4_],LY_STMT_CONFIG,"true","false",5,6,
                       &i);
            break;
          case 0x18:
            yin_print_extcomplex_flags
                      (plStack_10,module_local._4_4_,plStack_20,
                       (lys_ext_instance_complex *)_x[mod._4_4_],LY_STMT_MANDATORY,"false","true",
                       0x80,0x40,&i);
            break;
          case 0x19:
            yin_print_extcomplex_flags
                      (plStack_10,module_local._4_4_,plStack_20,
                       (lys_ext_instance_complex *)_x[mod._4_4_],LY_STMT_ORDEREDBY,"system","user",0
                       ,0x100,&i);
            break;
          case 0x1a:
            puVar5 = (ushort *)
                     ((long)&_x[mod._4_4_][1].arg_value +
                     *(long *)(_content2->padding + (long)c * 0x18 + -0x13) + 4);
            if ((puVar5 != (ushort *)0x0) && (*puVar5 != 0)) {
              if ((*puVar5 & 8) == 0) {
                if ((*puVar5 & 0x10) == 0) {
                  if ((*puVar5 & 0x20) == 0) break;
                  yin_print_close_parent(plStack_10,&i);
                  pp = (void **)anon_var_dwarf_13bf2;
                }
                else {
                  yin_print_close_parent(plStack_10,&i);
                  pp = (void **)anon_var_dwarf_13be6;
                }
              }
              else {
                yin_print_close_parent(plStack_10,&i);
                pp = (void **)anon_var_dwarf_13bda;
              }
              yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_STATUS,'\0',(char *)pp,
                                plStack_20,_x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size);
            }
            break;
          case 0x1b:
            pbVar6 = (byte *)((long)&_x[mod._4_4_][1].arg_value +
                             *(long *)(_content2->padding + (long)c * 0x18 + -0x13) + 4);
            if (pbVar6 != (byte *)0x0) {
              if ((*(uint *)&_content2->ref < 2) || (*(long *)pbVar6 == 0)) {
                if (*pbVar6 != 0) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DIGITS,'\0',
                                     plStack_20,_x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size,
                                     (uint)*pbVar6);
                }
              }
              else {
                for (flags._4_4_ = 0; *(char *)(*(long *)pbVar6 + (long)(int)flags._4_4_) != '\0';
                    flags._4_4_ = flags._4_4_ + 1) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DIGITS,
                                     (uint8_t)flags._4_4_,plStack_20,_x[mod._4_4_]->ext,
                                     (uint)_x[mod._4_4_]->ext_size,
                                     (uint)*(byte *)(*(long *)pbVar6 + (long)(int)flags._4_4_));
                }
              }
            }
            break;
          case 0x1c:
            plVar7 = (long *)((long)&_x[mod._4_4_][1].arg_value +
                             *(long *)(_content2->padding + (long)c * 0x18 + -0x13) + 4);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',plStack_20,
                                   _x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size,*(uint *)*plVar7
                                  );
              }
              else {
                flags._4_4_ = 0;
                while (*(long *)(*plVar7 + (long)(int)flags._4_4_ * 8) != 0) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,
                                     (uint8_t)flags._4_4_,plStack_20,_x[mod._4_4_]->ext,
                                     (uint)_x[mod._4_4_]->ext_size,
                                     **(uint **)(*plVar7 + (long)(int)flags._4_4_ * 8));
                  flags._4_4_ = flags._4_4_ + 1;
                }
              }
            }
            break;
          case 0x1d:
            plVar7 = (long *)((long)&_x[mod._4_4_][1].arg_value +
                             *(long *)(_content2->padding + (long)c * 0x18 + -0x13) + 4);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MIN,'\0',plStack_20,
                                   _x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size,*(uint *)*plVar7
                                  );
              }
              else {
                flags._4_4_ = 0;
                while (*(long *)(*plVar7 + (long)(int)flags._4_4_ * 8) != 0) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MIN,
                                     (uint8_t)flags._4_4_,plStack_20,_x[mod._4_4_]->ext,
                                     (uint)_x[mod._4_4_]->ext_size,
                                     **(uint **)(*plVar7 + (long)(int)flags._4_4_ * 8));
                  flags._4_4_ = flags._4_4_ + 1;
                }
              }
            }
            break;
          case 0x1e:
            plVar7 = (long *)((long)&_x[mod._4_4_][1].arg_value +
                             *(long *)(_content2->padding + (long)c * 0x18 + -0x13) + 4);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_POSITION,'\0',
                                   plStack_20,_x[mod._4_4_]->ext,(uint)_x[mod._4_4_]->ext_size,
                                   *(uint *)*plVar7);
              }
              else {
                flags._4_4_ = 0;
                while (*(long *)(*plVar7 + (long)(int)flags._4_4_ * 8) != 0) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_POSITION,
                                     (uint8_t)flags._4_4_,plStack_20,_x[mod._4_4_]->ext,
                                     (uint)_x[mod._4_4_]->ext_size,
                                     **(uint **)(*plVar7 + (long)(int)flags._4_4_ * 8));
                  flags._4_4_ = flags._4_4_ + 1;
                }
              }
            }
            break;
          case 0x1f:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_UNIQUE,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_unique(plStack_10,module_local._4_4_,(lys_unique *)*plVar7);
                local_60 = -1;
                j = 0;
                while (local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                               (char)local_60 + '\x01',LYEXT_SUBSTMT_UNIQUE),
                      local_60 != -1) {
                  yin_print_close_parent(plStack_10,&j);
                  yin_print_extension_instances
                            (plStack_10,module_local._4_4_ + 1,plStack_20,LYEXT_SUBSTMT_UNIQUE,'\0',
                             _x[mod._4_4_]->ext + local_60,1);
                }
                yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"unique",j);
              }
              else {
                p = (void *)*plVar7;
                flags._4_4_ = 0;
                for (; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_unique(plStack_10,module_local._4_4_,*p);
                  local_60 = -1;
                  j = 0;
                  do {
                    local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                            (char)local_60 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                    bVar9 = false;
                    if (local_60 != -1) {
                      bVar9 = _x[mod._4_4_]->ext[local_60]->insubstmt_index != flags._4_4_;
                    }
                  } while (bVar9);
                  if (local_60 != -1) {
                    yin_print_close_parent(plStack_10,&j);
                    do {
                      yin_print_extension_instances
                                (plStack_10,module_local._4_4_ + 1,plStack_20,LYEXT_SUBSTMT_UNIQUE,
                                 (uint8_t)flags._4_4_,_x[mod._4_4_]->ext + local_60,1);
                      do {
                        local_60 = lys_ext_iter(_x[mod._4_4_]->ext,_x[mod._4_4_]->ext_size,
                                                (char)local_60 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                        bVar9 = false;
                        if (local_60 != -1) {
                          bVar9 = _x[mod._4_4_]->ext[local_60]->insubstmt_index != flags._4_4_;
                        }
                      } while (bVar9);
                    } while (local_60 != -1);
                  }
                  yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"unique",j);
                  flags._4_4_ = flags._4_4_ + 1;
                }
              }
            }
            break;
          case 0x20:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_MODULE,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_model_(plStack_10,module_local._4_4_,(lys_module *)*plVar7);
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_model_(plStack_10,module_local._4_4_,*p);
                }
              }
            }
            break;
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x24:
          case 0x25:
          case 0x26:
          case 0x27:
          case 0x28:
          case 0x29:
          case 0x2a:
          case 0x2b:
          case 0x2c:
          case 0x2d:
          case 0x2e:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (*(LY_STMT *)(_content2->padding + (long)c * 0x18 + -0x1b),
                                        (lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              for (local_90 = (lys_node *)*plVar7; local_90 != (lys_node *)0x0;
                  local_90 = local_90->next) {
                LVar2 = lys_snode2stmt(local_90->nodetype);
                if (LVar2 == *(LY_STMT *)(_content2->padding + (long)c * 0x18 + -0x1b)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_snode(plStack_10,module_local._4_4_,local_90,0xffff);
                }
              }
            }
            break;
          case 0x2f:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_TYPEDEF,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_typedef(plStack_10,module_local._4_4_,plStack_20,(lys_tpdf *)*plVar7);
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_typedef(plStack_10,module_local._4_4_,plStack_20,*p);
                }
              }
            }
            break;
          case 0x30:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_TYPE,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_type(plStack_10,module_local._4_4_,plStack_20,(lys_type *)*plVar7);
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_type(plStack_10,module_local._4_4_,plStack_20,*p);
                }
              }
            }
            break;
          case 0x31:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_IFFEATURE,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_iffeature(plStack_10,module_local._4_4_,plStack_20,
                                    (lys_iffeature *)*plVar7);
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_iffeature(plStack_10,module_local._4_4_,plStack_20,*p);
                }
              }
            }
            break;
          case 0x32:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_LENGTH,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_typerestr(plStack_10,module_local._4_4_,plStack_20,(lys_restr *)*plVar7,
                                    "length");
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_typerestr(plStack_10,module_local._4_4_,plStack_20,*p,"length");
                }
              }
            }
            break;
          case 0x33:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_MUST,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_must(plStack_10,module_local._4_4_,plStack_20,(lys_restr *)*plVar7);
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_must(plStack_10,module_local._4_4_,plStack_20,*p);
                }
              }
            }
            break;
          case 0x34:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_PATTERN,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_typerestr(plStack_10,module_local._4_4_,plStack_20,(lys_restr *)*plVar7,
                                    "pattern");
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_typerestr(plStack_10,module_local._4_4_,plStack_20,*p,"pattern");
                }
              }
            }
            break;
          case 0x35:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_RANGE,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_typerestr(plStack_10,module_local._4_4_,plStack_20,(lys_restr *)*plVar7,
                                    "range");
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_typerestr(plStack_10,module_local._4_4_,plStack_20,*p,"range");
                }
              }
            }
            break;
          case 0x36:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_WHEN,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_when(plStack_10,module_local._4_4_,plStack_20,(lys_when *)*plVar7);
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_when(plStack_10,module_local._4_4_,plStack_20,*p);
                }
              }
            }
            break;
          case 0x37:
            plVar7 = (long *)lys_ext_complex_get_substmt
                                       (LY_STMT_REVISION,(lys_ext_instance_complex *)_x[mod._4_4_],
                                        (lyext_substmt **)0x0);
            if ((plVar7 != (long *)0x0) && (*plVar7 != 0)) {
              if (*(uint *)(_content2->padding + (long)c * 0x18 + -0xb) < 2) {
                yin_print_close_parent(plStack_10,&i);
                yin_print_revision(plStack_10,module_local._4_4_,plStack_20,(lys_revision *)*plVar7)
                ;
              }
              else {
                for (p = (void *)*plVar7; *p != 0; p = (void *)((long)p + 8)) {
                  yin_print_close_parent(plStack_10,&i);
                  yin_print_revision(plStack_10,module_local._4_4_,plStack_20,*p);
                }
              }
            }
          }
          c = c + 1;
        }
        module_local._4_4_ = module_local._4_4_ + -1;
      }
      yin_print_close(plStack_10,module_local._4_4_,(char *)info,_x[mod._4_4_]->def->name,i);
    }
    mod._4_4_ = mod._4_4_ + 1;
  } while( true );
}

Assistant:

static void
yin_print_extension_instances(struct lyout *out, int level, const struct lys_module *module,
                              LYEXT_SUBSTMT substmt, uint8_t substmt_index,
                              struct lys_ext_instance **ext, unsigned int count)
{
    unsigned int u, x;
    struct lys_module *mod;
    const char *prefix = NULL;
    struct lyext_substmt *info;
    int content, content2, i, j, c;
    uint16_t *flags;
    const char *str;
    void **pp, *p;
    struct lys_node *siter;

#define YIN_PRINT_EXTCOMPLEX_SNODE(STMT)                                                      \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    LY_TREE_FOR((struct lys_node*)(*pp), siter) {                                             \
        if (lys_snode2stmt(siter->nodetype) == STMT) {                                        \
            yin_print_close_parent(out, &content);                                            \
            yin_print_snode(out, level, siter, LYS_ANY);                                      \
        }                                                                                     \
    }
#define YIN_PRINT_EXTCOMPLEX_STRUCT(STMT, TYPE, FUNC)                                         \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    if (info[i].cardinality >= LY_STMT_CARD_SOME) { /* process array */                       \
        for (pp = *pp; *pp; pp++) {                                                           \
            yin_print_close_parent(out, &content);                                            \
            FUNC(out, level, (TYPE *)(*pp));                                                  \
        }                                                                                     \
    }